

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBarPrivate::setupMovableTab(QTabBarPrivate *this)

{
  QWidget *pQVar1;
  Tab *pTVar2;
  Representation RVar3;
  QRect QVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  QMovableTabWidget *pQVar9;
  QStyle *pQVar10;
  int iVar11;
  ulong uVar12;
  QRect *r;
  long in_FS_OFFSET;
  Representation RVar13;
  Representation RVar16;
  double extraout_XMM0_Qa;
  double dVar14;
  double dVar17;
  undefined1 auVar15 [16];
  Representation RVar18;
  undefined1 auVar19 [16];
  QRect QVar20;
  QStyleOptionTab tab;
  undefined1 *local_128;
  QWidget *pQStack_120;
  QStyle *local_118;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  QStyleOptionTab local_d8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (this->movingTab == (QMovableTabWidget *)0x0) {
    pQVar9 = (QMovableTabWidget *)operator_new(0x40);
    QWidget::QWidget((QWidget *)pQVar9,pQVar1,(WindowFlags)0x0);
    *(undefined ***)&pQVar9->super_QWidget = &PTR_metaObject_00809a58;
    *(undefined ***)&(pQVar9->super_QWidget).super_QPaintDevice = &PTR__QMovableTabWidget_00809c08;
    QPixmap::QPixmap(&pQVar9->m_pixmap);
    this->movingTab = pQVar9;
  }
  pQVar10 = QWidget::style(pQVar1);
  iVar5 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x13,0,pQVar1);
  uStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QVar20 = QTabBar::tabRect((QTabBar *)pQVar1,this->pressedIndex);
  local_e8._0_4_ = QVar20.x1.m_i;
  uStack_e0._4_4_ = QVar20.y2.m_i;
  RVar3.m_i = uStack_e0._4_4_;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    local_e8._4_4_ = QVar20.y1.m_i;
    uStack_e0 = QVar20._8_8_;
    local_e8._4_4_ = local_e8._4_4_ - iVar5;
    uStack_e0._4_4_ = RVar3.m_i + iVar5;
  }
  else {
    stack0xffffffffffffff1c = QVar20._4_12_;
    local_e8._0_4_ = local_e8._0_4_ - iVar5;
    QVar4 = _local_e8;
    uStack_e0._0_4_ = QVar20.x2.m_i;
    local_e8 = QVar4._0_8_;
    uStack_e0._0_4_ = uStack_e0._0_4_ + iVar5;
    _local_e8 = (QRect)CONCAT412(RVar3.m_i,_local_e8);
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  RVar13 = local_e8._0_4_;
  RVar18 = local_e8._8_4_;
  RVar3 = local_e8._12_4_;
  RVar16 = local_e8._4_4_;
  uVar6 = QPaintDevice::devicePixelRatio();
  dVar14 = extraout_XMM0_Qa * (double)((RVar18.m_i - RVar13.m_i) + 1);
  dVar17 = extraout_XMM0_Qa * (double)((RVar3.m_i - RVar16.m_i) + 1);
  auVar15._0_8_ = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
  auVar15._8_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
  auVar15 = minpd(_DAT_0066f5d0,auVar15);
  auVar19._8_8_ = -(ulong)(-2147483648.0 < auVar15._8_8_);
  auVar19._0_8_ = -(ulong)(-2147483648.0 < auVar15._0_8_);
  uVar7 = movmskpd(uVar6,auVar19);
  uVar12 = 0x8000000000000000;
  if ((uVar7 & 2) != 0) {
    uVar12 = (ulong)(uint)(int)auVar15._8_8_ << 0x20;
  }
  local_d8.super_QStyleOption._0_8_ = 0x80000000;
  if ((uVar7 & 1) != 0) {
    local_d8.super_QStyleOption._0_8_ = (ulong)(uint)(int)auVar15._0_8_;
  }
  local_d8.super_QStyleOption._0_8_ = local_d8.super_QStyleOption._0_8_ | uVar12;
  QPixmap::QPixmap((QPixmap *)local_108,(QSize *)&local_d8);
  dVar14 = (double)QPaintDevice::devicePixelRatio();
  QPixmap::setDevicePixelRatio(dVar14);
  QColor::QColor((QColor *)&local_d8,transparent);
  QPixmap::fill((QColor *)local_108);
  local_118 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_120 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_128);
  pQStack_120 = pQVar1;
  local_118 = QWidget::style(pQVar1);
  QPainter::begin((QPaintDevice *)&local_128);
  QPainter::setRenderHint((RenderHint)(QPainter *)&local_128,true);
  memset(&local_d8,0xaa,0xa0);
  QStyleOptionTab::QStyleOptionTab(&local_d8);
  (**(code **)(*(long *)pQVar1 + 0x1c8))(pQVar1,&local_d8,this->pressedIndex);
  local_d8.position = Moving;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    iVar11 = -local_d8.super_QStyleOption.rect.x1.m_i;
    local_d8.super_QStyleOption.rect.x1.m_i = 0;
    iVar8 = iVar5 - local_d8.super_QStyleOption.rect.y1.m_i;
    local_d8.super_QStyleOption.rect.y1.m_i = iVar5;
  }
  else {
    iVar11 = iVar5 - local_d8.super_QStyleOption.rect.x1.m_i;
    iVar8 = -local_d8.super_QStyleOption.rect.y1.m_i;
    local_d8.super_QStyleOption.rect.y1.m_i = 0;
    local_d8.super_QStyleOption.rect.x1.m_i = iVar5;
  }
  local_d8.super_QStyleOption.rect.y2.m_i = local_d8.super_QStyleOption.rect.y2.m_i + iVar8;
  local_d8.super_QStyleOption.rect.x2.m_i = local_d8.super_QStyleOption.rect.x2.m_i + iVar11;
  (**(code **)(*(long *)local_118 + 0xb8))(local_118,7,&local_d8,&local_128,pQStack_120);
  QPainter::end();
  pQVar9 = this->movingTab;
  QPixmap::operator=(&pQVar9->m_pixmap,(QPixmap *)local_108);
  QWidget::update(&pQVar9->super_QWidget);
  r = (QRect *)local_e8;
  QWidget::setGeometry(&this->movingTab->super_QWidget,r);
  iVar5 = (int)r;
  QWidget::raise(&this->movingTab->super_QWidget,iVar5);
  pTVar2 = (this->tabList).d.ptr[this->pressedIndex];
  pQVar1 = pTVar2->leftWidget;
  if (pQVar1 != (QWidget *)0x0) {
    QWidget::raise(pQVar1,iVar5);
  }
  pQVar1 = pTVar2->rightWidget;
  if (pQVar1 != (QWidget *)0x0) {
    QWidget::raise(pQVar1,iVar5);
  }
  if ((QWidget *)this->leftB != (QWidget *)0x0) {
    QWidget::raise((QWidget *)this->leftB,iVar5);
  }
  if ((QWidget *)this->rightB != (QWidget *)0x0) {
    QWidget::raise((QWidget *)this->rightB,iVar5);
  }
  (**(code **)(*(long *)&this->movingTab->super_QWidget + 0x68))(this->movingTab,1);
  QIcon::~QIcon(&local_d8.icon);
  if (&(local_d8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption(&local_d8.super_QStyleOption);
  QPainter::~QPainter((QPainter *)&local_128);
  QPixmap::~QPixmap((QPixmap *)local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::setupMovableTab()
{
    Q_Q(QTabBar);
    if (!movingTab)
        movingTab = new QMovableTabWidget(q);

    int taboverlap = q->style()->pixelMetric(QStyle::PM_TabBarTabOverlap, nullptr ,q);
    QRect grabRect = q->tabRect(pressedIndex);
    if (verticalTabs(shape))
        grabRect.adjust(0, -taboverlap, 0, taboverlap);
    else
        grabRect.adjust(-taboverlap, 0, taboverlap, 0);

    QPixmap grabImage(grabRect.size() * q->devicePixelRatio());
    grabImage.setDevicePixelRatio(q->devicePixelRatio());
    grabImage.fill(Qt::transparent);
    QStylePainter p(&grabImage, q);

    QStyleOptionTab tab;
    q->initStyleOption(&tab, pressedIndex);
    tab.position = QStyleOptionTab::Moving;
    if (verticalTabs(shape))
        tab.rect.moveTopLeft(QPoint(0, taboverlap));
    else
        tab.rect.moveTopLeft(QPoint(taboverlap, 0));
    p.drawControl(QStyle::CE_TabBarTab, tab);
    p.end();

    movingTab->setPixmap(grabImage);
    movingTab->setGeometry(grabRect);
    movingTab->raise();

    // Re-arrange widget order to avoid overlaps
    const auto &pressedTab = *tabList.at(pressedIndex);
    if (pressedTab.leftWidget)
        pressedTab.leftWidget->raise();
    if (pressedTab.rightWidget)
        pressedTab.rightWidget->raise();
    if (leftB)
        leftB->raise();
    if (rightB)
        rightB->raise();
    movingTab->setVisible(true);
}